

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O2

_Bool get_move_find_safety(monster *mon)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  uint16_t **ppuVar3;
  wchar_t wVar4;
  ulong uVar5;
  _Bool _Var6;
  wchar_t wVar7;
  ulong uVar8;
  loc_conflict grid2;
  loc grid;
  long lVar9;
  loc local_48;
  ulong local_40;
  
  wVar4 = L'\0';
  uVar5 = 1;
  do {
    uVar8 = uVar5;
    if (uVar8 == 10) goto LAB_0017b36e;
    local_48 = (loc)loc(0,0);
    local_40 = (ulong)local_48 >> 0x20;
    pwVar1 = dist_offsets_y[uVar8];
    pwVar2 = dist_offsets_x[uVar8];
    lVar9 = 0;
    while( true ) {
      if (*(int *)((long)pwVar2 + lVar9) == 0 && *(int *)((long)pwVar1 + lVar9) == 0) break;
      grid2 = loc(*(int *)((long)pwVar2 + lVar9),*(int *)((long)pwVar1 + lVar9));
      grid = (loc)loc_sum(mon->grid,grid2);
      _Var6 = square_in_bounds_fully(cave,grid);
      if (_Var6) {
        _Var6 = square_ispassable(cave,grid);
        if ((_Var6) &&
           (ppuVar3 = (cave->noise).grids,
           (uint)ppuVar3[(long)grid >> 0x20][grid.x] <=
           (uint)ppuVar3[(mon->grid).y][(mon->grid).x] + (int)uVar8 * 2)) {
          _Var6 = monster_hates_grid(mon,(loc_conflict)grid);
          if (!_Var6) {
            _Var6 = square_isview(cave,grid);
            if (!_Var6) {
              wVar7 = distance((loc_conflict)grid,player->grid);
              if (wVar4 < wVar7) {
                local_40 = (ulong)grid >> 0x20;
                local_48 = grid;
                wVar4 = wVar7;
              }
            }
          }
        }
      }
      lVar9 = lVar9 + 4;
    }
    uVar5 = uVar8 + 1;
  } while (wVar4 < L'\x01');
  (mon->target).grid.x = local_48.x;
  (mon->target).grid.y = (int)local_40;
LAB_0017b36e:
  return uVar8 < 10;
}

Assistant:

static bool get_move_find_safety(struct monster *mon)
{
	int i, dy, dx, d, dis, gdis = 0;

	const int *y_offsets;
	const int *x_offsets;

	/* Start with adjacent locations, spread further */
	for (d = 1; d < 10; d++) {
		struct loc best = loc(0, 0);

		/* Get the lists of points with a distance d from (fx, fy) */
		y_offsets = dist_offsets_y[d];
		x_offsets = dist_offsets_x[d];

		/* Check the locations */
		for (i = 0, dx = x_offsets[0], dy = y_offsets[0];
		     dx != 0 || dy != 0;
		     i++, dx = x_offsets[i], dy = y_offsets[i]) {
			struct loc grid = loc_sum(mon->grid, loc(dx, dy));

			/* Skip illegal locations */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Skip locations in a wall */
			if (!square_ispassable(cave, grid)) continue;

			/* Ignore too-distant grids */
			if (cave->noise.grids[grid.y][grid.x] >
				cave->noise.grids[mon->grid.y][mon->grid.x] + 2 * d)
				continue;

			/* Ignore damaging terrain if they can't handle it */
			if (monster_hates_grid(mon, grid)) continue;

			/* Check for absence of shot (more or less) */
			if (!square_isview(cave, grid)) {
				/* Calculate distance from player */
				dis = distance(grid, player->grid);

				/* Remember if further than previous */
				if (dis > gdis) {
					best = grid;
					gdis = dis;
				}
			}
		}

		/* Check for success */
		if (gdis > 0) {
			/* Good location */
			mon->target.grid = best;
			return (true);
		}
	}

	/* No safe place */
	return (false);
}